

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

object_ptr __thiscall
mjs::interpreter::impl::create_function(impl *this,function_base *f,scope_ptr *prev_scope)

{
  uint uVar1;
  undefined8 extraout_RDX;
  long lVar2;
  object_ptr oVar3;
  gc_heap_ptr_untyped local_68;
  scope_ptr local_58;
  undefined1 local_48 [24];
  undefined8 local_30;
  
  local_30 = *(undefined8 *)&prev_scope[1].super_gc_heap_ptr_untyped.pos_;
  local_48._16_8_ = prev_scope[2].super_gc_heap_ptr_untyped.heap_;
  string::string((string *)&local_68,
                 (gc_heap *)
                 (f->body_extend_).file.
                 super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (wstring_view *)(local_48 + 0x10));
  uVar1 = *(uint *)&prev_scope[1].super_gc_heap_ptr_untyped.heap_;
  lVar2 = (ulong)uVar1 * 4 +
          *(long *)&((prev_scope->super_gc_heap_ptr_untyped).heap_)->owns_storage_;
  local_58.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_48;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_58,lVar2,
             lVar2 + (ulong)(*(int *)((long)&prev_scope[1].super_gc_heap_ptr_untyped.heap_ + 4) -
                            uVar1) * 4);
  create_function(this,(string *)f,(shared_ptr<mjs::block_statement> *)&local_68,
                  (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)(prev_scope + 5),(wstring *)&prev_scope[3].super_gc_heap_ptr_untyped.pos_,
                  &local_58);
  if (local_58.super_gc_heap_ptr_untyped.heap_ != (gc_heap *)local_48) {
    operator_delete(local_58.super_gc_heap_ptr_untyped.heap_,local_48._0_8_ * 4 + 4);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_68);
  oVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr create_function(const function_base& f, const scope_ptr& prev_scope) {
        return create_function(string{heap_, f.id()}, f.block_ptr(), f.params(), std::wstring{f.body_extend().source_view()}, prev_scope);
    }